

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::currentChanged(QFileDialogPrivate *this,QModelIndex *index)

{
  QFileDialog *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_58;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  updateOkButton(this);
  this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  QModelIndex::data(&local_40,index,0x101);
  ::QVariant::toString();
  QFileDialog::currentChanged(this_00,(QString *)&QStack_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
  ::QVariant::~QVariant(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::currentChanged(const QModelIndex &index)
{
    updateOkButton();
    emit q_func()->currentChanged(index.data(QFileSystemModel::FilePathRole).toString());
}